

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.h
# Opt level: O1

bool __thiscall
absl::lts_20250127::str_format_internal::FormatArgImpl::Dispatch<float>
          (FormatArgImpl *this,Data arg,FormatConversionSpecImpl spec,void *out)

{
  StringConvertResult SVar1;
  uint uVar2;
  FormatConversionSpecImpl conv;
  undefined4 local_8;
  
  if (arg.buf[0] != '\x13') {
    if ((2L << ((byte)(FormatSinkImpl *)((ulong)arg.ptr & 0xffffffff) & 0x3f) & 0x9fe00U) != 0) {
      local_8 = SUB84(this,0);
      uVar2 = spec._0_4_;
      conv.width_ = 0;
      conv.conv_ = (char)uVar2;
      conv.flags_ = (char)(uVar2 >> 8);
      conv.length_mod_ = (char)(uVar2 >> 0x10);
      conv._3_1_ = (char)(uVar2 >> 0x18);
      conv.precision_ = spec.precision_;
      SVar1 = str_format_internal::FormatConvertImpl
                        ((str_format_internal *)arg.ptr,local_8,conv,
                         (FormatSinkImpl *)((ulong)arg.ptr & 0xffffffff));
      goto LAB_0014dbc2;
    }
  }
  SVar1.value = false;
LAB_0014dbc2:
  return (bool)(SVar1.value & 1);
}

Assistant:

static bool Dispatch(Data arg, FormatConversionSpecImpl spec, void* out) {
    // A `none` conv indicates that we want the `int` conversion.
    if (ABSL_PREDICT_FALSE(spec.conversion_char() ==
                           FormatConversionCharInternal::kNone)) {
      return ToInt<T>(arg, static_cast<int*>(out), std::is_integral<T>(),
                      std::is_enum<T>());
    }
    if (ABSL_PREDICT_FALSE(!Contains(ArgumentToConv<T>(),
                                     spec.conversion_char()))) {
      return false;
    }
    return str_format_internal::FormatConvertImpl(
               Manager<T>::Value(arg), spec,
               static_cast<FormatSinkImpl*>(out))
        .value;
  }